

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  char *__s;
  long *plVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  time_t tVar6;
  size_t sVar7;
  Cookie *pCVar8;
  char *__s_00;
  char *pcVar9;
  size_t sVar10;
  long *__base;
  long lVar11;
  Cookie *pCVar12;
  Cookie *pCVar13;
  Cookie *pCVar14;
  Cookie *pCVar15;
  size_t __nmemb;
  byte bVar16;
  undefined1 local_34 [4];
  
  bVar16 = 0;
  tVar6 = time((time_t *)0x0);
  if (c == (CookieInfo *)0x0) {
    return (Cookie *)0x0;
  }
  if (c->cookies != (Cookie *)0x0) {
    remove_expired(c);
    iVar4 = inet_pton(2,host,local_34);
    pCVar15 = c->cookies;
    if (pCVar15 == (Cookie *)0x0) {
      pCVar12 = (Cookie *)0x0;
      __nmemb = 0;
    }
    else {
      __nmemb = 0;
      pCVar12 = (Cookie *)0x0;
      do {
        if ((((pCVar15->expires == 0) || (tVar6 < pCVar15->expires)) &&
            ((byte)(pCVar15->secure ^ 1U | secure) == 1)) &&
           (((pCVar15->domain == (char *)0x0 ||
             ((pCVar15->tailmatch == true && iVar4 == 0 &&
              (_Var3 = tailmatch(pCVar15->domain,host), _Var3)))) ||
            (((byte)(pCVar15->tailmatch ^ 1U | iVar4 != 0) == 1 &&
             (iVar5 = Curl_raw_equal(host,pCVar15->domain), iVar5 != 0)))))) {
          __s = pCVar15->spath;
          if ((__s == (char *)0x0) || (sVar7 = strlen(__s), sVar7 == 1)) goto LAB_0048806b;
          __s_00 = (*Curl_cstrdup)(path);
          if (__s_00 != (char *)0x0) {
            pcVar9 = strchr(__s_00,0x3f);
            if (pcVar9 != (char *)0x0) {
              *pcVar9 = '\0';
            }
            if (*__s_00 != '/') {
              (*Curl_cfree)(__s_00);
              __s_00 = (*Curl_cstrdup)("/");
              if (__s_00 == (char *)0x0) goto LAB_00488132;
            }
            sVar10 = strlen(__s_00);
            if ((sVar10 < sVar7) || (iVar5 = strncmp(__s,__s_00,sVar7), iVar5 != 0)) {
              (*Curl_cfree)(__s_00);
            }
            else {
              if (sVar7 == sVar10) {
                (*Curl_cfree)(__s_00);
              }
              else {
                cVar1 = __s_00[sVar7];
                (*Curl_cfree)(__s_00);
                if (cVar1 != '/') goto LAB_00488132;
              }
LAB_0048806b:
              pCVar8 = (Cookie *)(*Curl_cmalloc)(0x60);
              if (pCVar8 == (Cookie *)0x0) goto joined_r0x00488214;
              pCVar13 = pCVar15;
              pCVar14 = pCVar8;
              for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
                pCVar14->next = pCVar13->next;
                pCVar13 = (Cookie *)((long)pCVar13 + ((ulong)bVar16 * -2 + 1) * 8);
                pCVar14 = (Cookie *)((long)pCVar14 + (ulong)bVar16 * -0x10 + 8);
              }
              pCVar8->next = pCVar12;
              __nmemb = __nmemb + 1;
              pCVar12 = pCVar8;
            }
          }
        }
LAB_00488132:
        pCVar15 = pCVar15->next;
      } while (pCVar15 != (Cookie *)0x0);
    }
    if (__nmemb == 0) {
      return pCVar12;
    }
    __base = (long *)(*Curl_cmalloc)(__nmemb * 8);
    plVar2 = __base;
    if (__base != (long *)0x0) {
      for (; pCVar12 != (Cookie *)0x0; pCVar12 = pCVar12->next) {
        *plVar2 = (long)pCVar12;
        plVar2 = plVar2 + 1;
      }
      qsort(__base,__nmemb,8,cookie_sort);
      pCVar12 = (Cookie *)*__base;
      if (__nmemb != 1) {
        sVar7 = 1;
        do {
          *(long *)__base[sVar7 - 1] = __base[sVar7];
          sVar7 = sVar7 + 1;
        } while (__nmemb != sVar7);
      }
      *(undefined8 *)__base[__nmemb - 1] = 0;
      (*Curl_cfree)(__base);
    }
    if (__base != (long *)0x0) {
      return pCVar12;
    }
joined_r0x00488214:
    while (pCVar12 != (Cookie *)0x0) {
      pCVar15 = pCVar12->next;
      (*Curl_cfree)(pCVar12);
      pCVar12 = pCVar15;
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  time_t now = time(NULL);
  struct Cookie *mainco=NULL;
  size_t matches = 0;
  bool is_ip;

  if(!c || !c->cookies)
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies;

  while(co) {
    /* only process this cookie if it is not expired or had no expire
       date AND that if the cookie requires we're secure we must only
       continue if we are! */
    if((!co->expires || (co->expires > now)) &&
       (co->secure?secure:TRUE)) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && Curl_raw_equal(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = malloc(sizeof(struct Cookie));
          if(newco) {
            /* first, copy the whole source cookie: */
            memcpy(newco, co, sizeof(struct Cookie));

            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else {
            fail:
            /* failure, clear up the allocated chain and return NULL */
            while(mainco) {
              co = mainco->next;
              free(mainco);
              mainco = co;
            }

            return NULL;
          }
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i=0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i=0; i<matches-1; i++)
      array[i]->next = array[i+1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */
}